

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

int Iso_ManNegEdgeNum(Aig_Man_t *pAig)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  int i;
  
  iVar3 = pAig->nComplEdges;
  if (iVar3 < 1) {
    iVar3 = 0;
    for (i = 0; i < pAig->vObjs->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(pAig->vObjs,i);
      if (pvVar1 != (void *)0x0) {
        uVar2 = (uint)*(undefined8 *)((long)pvVar1 + 0x18);
        if ((uVar2 & 7) - 7 < 0xfffffffe) {
          if ((uVar2 & 7) == 3) {
            iVar3 = iVar3 + (*(uint *)((long)pvVar1 + 8) & 1);
          }
        }
        else {
          iVar3 = (*(uint *)((long)pvVar1 + 0x10) & 1) + (*(uint *)((long)pvVar1 + 8) & 1) + iVar3;
        }
      }
    }
    pAig->nComplEdges = iVar3;
  }
  return iVar3;
}

Assistant:

int Iso_ManNegEdgeNum( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( pAig->nComplEdges > 0 )
        return pAig->nComplEdges;
    Aig_ManForEachObj( pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
        {
            Counter += Aig_ObjFaninC0(pObj);
            Counter += Aig_ObjFaninC1(pObj);
        }
        else if ( Aig_ObjIsCo(pObj) )
            Counter += Aig_ObjFaninC0(pObj);
    return (pAig->nComplEdges = Counter);
}